

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall clunk::Node::GetPawnMoves<true,true>(Node *this,int from,int depth)

{
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  Move *pMVar12;
  uint to;
  uint cap;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x617,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  uVar14 = (ulong)(uint)from;
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x618,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  pcVar3 = (char *)(&_board)[uVar14];
  if (pcVar3 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x619,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if (*pcVar3 != '\x03') {
    __assert_fail("_board[from]->type == (color|Pawn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61a,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  if ((uint)(byte)pcVar3[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61b,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                 );
  }
  uVar4 = GetPinDir(this,true,from);
  uVar7 = 0;
  if (depth == 0) {
    uVar5 = GetDiscoverDir(this,true,from);
    uVar7 = uVar5 + 0x10 & 0xffffffdf;
    if (uVar7 != 0) {
      uVar7 = uVar5;
    }
  }
  uVar8 = (ulong)(from | 8);
  if (*(ulong *)(_pawnCaps + uVar8 * 8) != 0) {
    uVar13 = *(ulong *)(_pawnCaps + uVar8 * 8);
    do {
      if ((uVar13 & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x629,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      uVar5 = (uint)(uVar13 & 0xff);
      to = uVar5 - 1;
      if ((to & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100,"int clunk::Distance(const int, const int)");
      }
      if ((&_dist)[(ulong)to + uVar14 * 0x80] != '\x01') {
        __assert_fail("Distance(from, to) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x62b,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      bVar6 = (&_dir)[(ulong)to + uVar14 * 0x80];
      if (((0x11 < bVar6) || ((0x38002U >> (bVar6 & 0x1f) & 1) == 0)) &&
         ((0x10 < bVar6 - 0xef || ((0x10007U >> (bVar6 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(Direction(from, to))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x62c,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      if ((uVar4 == 0) || (uVar4 == (byte)((bVar6 ^ (char)bVar6 >> 7) - ((char)bVar6 >> 7)))) {
        bVar6 = *(byte *)(&_board)[to];
        if ((bVar6 == 0) && ((byte *)(&_board)[to] != _EMPTY)) {
          __assert_fail("cap || (_board[to] == _EMPTY)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x631,
                        "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                       );
        }
        cap = (uint)bVar6;
        if (cap == 0) {
          uVar5 = this->ep;
          if (((uVar5 != 0x78) && (to == uVar5)) &&
             (bVar15 = EpPinned<true>(from,uVar5 + 0x10), !bVar15)) {
            iVar9 = this->moveCount;
            lVar10 = (long)iVar9;
            if (lVar10 < 0) goto LAB_0013217b;
            if (0x7e < iVar9) goto LAB_0013219a;
            this->moveCount = iVar9 + 1;
            iVar9 = 100;
            cap = 0;
LAB_00131ca2:
            iVar11 = 0;
LAB_00131ca5:
            pMVar12 = this->moves + lVar10;
            Move::Set(pMVar12,PawnCap,from,to,cap,iVar11,iVar9);
            iVar9 = 0;
            if (pMVar12->bits == this->killer[1].bits) {
              iVar9 = 0x32;
            }
            if (pMVar12->bits == this->killer[0].bits) {
              iVar9 = 0x32;
            }
            Move::IncScore(pMVar12,iVar9);
          }
        }
        else if ((bVar6 & 1) == 0) {
          if (9 < bVar6 - 2) {
            __assert_fail("!pc || IS_CAP(pc)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x114,"int clunk::ValueOf(const int)");
          }
          iVar9 = *(int *)(_VALUE_OF + (ulong)cap * 4);
          if (0x10 < uVar5) {
            iVar11 = this->moveCount;
            lVar10 = (long)iVar11;
            if (-1 < lVar10) {
              if (iVar11 < 0x7f) {
                this->moveCount = iVar11 + 1;
                goto LAB_00131ca2;
              }
              goto LAB_0013219a;
            }
            goto LAB_0013217b;
          }
          iVar11 = this->moveCount;
          lVar10 = (long)iVar11;
          if (lVar10 < 0) goto LAB_0013217b;
          if (0x7e < iVar11) goto LAB_0013219a;
          this->moveCount = iVar11 + 1;
          cap = (uint)bVar6;
          Move::Set(this->moves + lVar10,PawnCap,from,to,(uint)bVar6,0xb,iVar9 + 0x3cf);
          uVar1 = this->moves[lVar10].bits;
          iVar11 = 0;
          if (uVar1 == this->killer[1].bits) {
            iVar11 = 0x32;
          }
          if (uVar1 == this->killer[0].bits) {
            iVar11 = 0x32;
          }
          Move::IncScore(this->moves + lVar10,iVar11);
          if (depth == 0) {
            iVar11 = this->moveCount;
            lVar10 = (long)iVar11;
            if (-1 < lVar10) {
              if (iVar11 < 0x7f) {
                this->moveCount = iVar11 + 1;
                Move::Set(this->moves + lVar10,PawnCap,from,to,cap,9,iVar9 + 500);
                uVar1 = this->moves[lVar10].bits;
                iVar11 = 0;
                if (uVar1 == this->killer[1].bits) {
                  iVar11 = 0x32;
                }
                if (uVar1 == this->killer[0].bits) {
                  iVar11 = 0x32;
                }
                Move::IncScore(this->moves + lVar10,iVar11);
                iVar11 = this->moveCount;
                lVar10 = (long)iVar11;
                if (-1 < lVar10) {
                  if (iVar11 < 0x7f) {
                    this->moveCount = iVar11 + 1;
                    Move::Set(this->moves + lVar10,PawnCap,from,to,cap,7,iVar9 + 0x140);
                    uVar1 = this->moves[lVar10].bits;
                    iVar11 = 0;
                    if (uVar1 == this->killer[1].bits) {
                      iVar11 = 0x32;
                    }
                    if (uVar1 == this->killer[0].bits) {
                      iVar11 = 0x32;
                    }
                    Move::IncScore(this->moves + lVar10,iVar11);
                    iVar11 = this->moveCount;
                    lVar10 = (long)iVar11;
                    if (-1 < lVar10) {
                      if (iVar11 < 0x7f) {
                        iVar9 = iVar9 + 300;
                        this->moveCount = iVar11 + 1;
                        iVar11 = 5;
                        goto LAB_00131ca5;
                      }
                      goto LAB_0013219a;
                    }
                    goto LAB_0013217b;
                  }
                  goto LAB_0013219a;
                }
                goto LAB_0013217b;
              }
              goto LAB_0013219a;
            }
            goto LAB_0013217b;
          }
        }
      }
      bVar15 = 0xff < uVar13;
      uVar13 = uVar13 >> 8;
    } while (bVar15);
  }
  if ((uint)from >> 4 == 1 || depth == 0) {
    uVar5 = from - 0x10;
    if (uVar4 != 0) {
      if (0x7f < uVar5) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x107,"int clunk::Direction(const int, const int)");
      }
      bVar6 = (char)(&_dir)[(ulong)uVar5 + uVar14 * 0x80] >> 7;
      if (uVar4 != (byte)(((&_dir)[(ulong)uVar5 + uVar14 * 0x80] ^ bVar6) - bVar6)) {
        return;
      }
    }
    if ((undefined *)(&_board)[(int)uVar5] == _EMPTY) {
      if (from - 1U < 0x1f) {
        iVar9 = this->moveCount;
        if (-1 < (long)iVar9) {
          if (iVar9 < 0x7f) {
            this->moveCount = iVar9 + 1;
            pMVar12 = this->moves + iVar9;
            Move::Set(pMVar12,PawnMove,from,uVar5,0,0xb,0x3cf);
            iVar9 = 0;
            if (pMVar12->bits == this->killer[1].bits) {
              iVar9 = 0x32;
            }
            if (pMVar12->bits == this->killer[0].bits) {
              iVar9 = 0x32;
            }
            Move::IncScore(pMVar12,iVar9);
            if (depth != 0) {
              return;
            }
            iVar9 = this->moveCount;
            lVar10 = (long)iVar9;
            if (lVar10 < 0) goto LAB_0013217b;
            if (iVar9 < 0x7f) {
              this->moveCount = iVar9 + 1;
              Move::Set(this->moves + lVar10,PawnMove,from,uVar5,0,9,500);
              uVar1 = this->moves[lVar10].bits;
              iVar9 = 0;
              if (uVar1 == this->killer[1].bits) {
                iVar9 = 0x32;
              }
              if (uVar1 == this->killer[0].bits) {
                iVar9 = 0x32;
              }
              Move::IncScore(this->moves + lVar10,iVar9);
              iVar9 = this->moveCount;
              lVar10 = (long)iVar9;
              if (lVar10 < 0) goto LAB_0013217b;
              if (iVar9 < 0x7f) {
                this->moveCount = iVar9 + 1;
                Move::Set(this->moves + lVar10,PawnMove,from,uVar5,0,7,0x140);
                uVar1 = this->moves[lVar10].bits;
                iVar9 = 0;
                if (uVar1 == this->killer[1].bits) {
                  iVar9 = 0x32;
                }
                if (uVar1 == this->killer[0].bits) {
                  iVar9 = 0x32;
                }
                Move::IncScore(this->moves + lVar10,iVar9);
                iVar9 = this->moveCount;
                lVar10 = (long)iVar9;
                if (lVar10 < 0) goto LAB_0013217b;
                if (iVar9 < 0x7f) {
                  this->moveCount = iVar9 + 1;
                  Move::Set(this->moves + lVar10,PawnMove,from,uVar5,0,5,300);
                  uVar1 = this->moves[lVar10].bits;
                  iVar9 = 0;
                  if (uVar1 == this->killer[1].bits) {
                    iVar9 = 0x32;
                  }
                  if (uVar1 == this->killer[0].bits) {
                    iVar9 = 0x32;
                  }
                  Move::IncScore(this->moves + lVar10,iVar9);
                  return;
                }
              }
            }
          }
LAB_0013219a:
          __assert_fail("(moveCount + 1) < MaxMoves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x60e,
                        "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                       );
        }
LAB_0013217b:
        __assert_fail("moveCount >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x60d,
                      "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                     );
      }
      if (depth != 0) {
        __assert_fail("!depth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x658,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = true, qsearch = true]"
                     );
      }
      if ((from - 0x1fU == (uint)(byte)_KING[1] || from - 0x21U == (uint)(byte)_KING[1]) ||
          uVar7 != 0) {
        iVar9 = this->moveCount;
        if ((long)iVar9 < 0) goto LAB_0013217b;
        if (0x7e < iVar9) goto LAB_0013219a;
        iVar11 = *(int *)(_DIR_SHIFT + (long)from * 4 + 0x70);
        iVar2 = *(int *)(_PAWN_SQR + uVar8 * 4);
        this->moveCount = iVar9 + 1;
        pMVar12 = this->moves + iVar9;
        Move::Set(pMVar12,PawnMove,from,uVar5,0,0,(iVar11 - iVar2) + 0x19);
        iVar9 = 0;
        if (pMVar12->bits == this->killer[1].bits) {
          iVar9 = 0x32;
        }
        if (pMVar12->bits == this->killer[0].bits) {
          iVar9 = 0x32;
        }
        Move::IncScore(pMVar12,iVar9);
      }
      if ((((uint)from >> 4 == 6) && ((undefined *)(&_board)[from - 0x20U] == _EMPTY)) &&
         (uVar7 != 0 ||
          (from - 0x2fU == (uint)(byte)_KING[1] || from - 0x31U == (uint)(byte)_KING[1]))) {
        AddMove(this,PawnLung,from,from - 0x20U,
                (*(int *)(_PAWN_SQR + (ulong)(from - 0x18) * 4) - *(int *)(_PAWN_SQR + uVar8 * 4)) +
                0x1e,0,0);
      }
    }
  }
  return;
}

Assistant:

void GetPawnMoves(const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Pawn));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    int to;

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
      if (abs(kdir) == North) {
        kdir = 0;
      }
    }

    for (uint64_t mvs = _pawnCaps[from + (color * 8)]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        continue;
      }
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if ((ep != None) && (to == ep) &&
            !EpPinned<color>(from, (ep + (color ? North : South))))
        {
          AddMove(PawnCap, from, to, PawnValue);
        }
      }
      else if (COLOR(cap) != color) {
        score = ValueOf(cap);
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnCap, from, to, (score + QueenValue),  cap, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnCap, from, to, (score + RookValue),   cap, (color|Rook));
            AddMove(PawnCap, from, to, (score + BishopValue), cap, (color|Bishop));
            AddMove(PawnCap, from, to, (score + KnightValue), cap, (color|Knight));
          }
        }
        else {
          AddMove(PawnCap, from, to, score, cap);
        }
      }
    }
    if (!qsearch || ((!depth) | (YC(from) == (color ? 1 : 6)))) {
      to = (from + (color ? South : North));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        return;
      }
      if (_board[to] == _EMPTY) {
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnMove, from, to, QueenValue,  0, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnMove, from, to, RookValue,   0, (color|Rook));
            AddMove(PawnMove, from, to, BishopValue, 0, (color|Bishop));
            AddMove(PawnMove, from, to, KnightValue, 0, (color|Knight));
          }
        }
        else {
          if (qsearch) {
            assert(!depth);
            if (kdir |
                ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
            {
              score = (_PAWN_SQR[to + (8 * color)] -
                       _PAWN_SQR[from + (8 * color)] + 25);
              AddMove(PawnMove, from, to, score);
            }
          }
          else {
            score = (_PAWN_SQR[to + (8 * color)] -
                     _PAWN_SQR[from + (8 * color)] + 5);
            AddMove(PawnMove, from, to, score);
          }
          if (YC(from) == (color ? 6 : 1)) {
            to += (color ? South : North);
            assert(IS_SQUARE(to));
            if (_board[to] == _EMPTY) {
              if (qsearch) {
                assert(!depth);
                if (kdir |
                    ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                    ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
                {
                  score = (_PAWN_SQR[to + (8 * color)] -
                           _PAWN_SQR[from + (8 * color)] + 30);
                  AddMove(PawnLung, from, to, score);
                }
              }
              else {
                score = (_PAWN_SQR[to + (8 * color)] -
                         _PAWN_SQR[from + (8 * color)] + 10);
                AddMove(PawnLung, from, to, score);
              }
            }
          }
        }
      }
    }
  }